

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O2

deUint32 deqp::egl::anon_unknown_0::createGLES2Program(Functions *gl,TestLog *log)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  TestError *this;
  size_t sVar5;
  void *__buf;
  void *__buf_00;
  allocator<char> local_11d;
  deInt32 fragmentCompileStatus;
  deInt32 vertexCompileStatus;
  deInt32 linkStatus;
  deInt32 infoLogLength;
  string local_c0;
  string programInfoLog;
  string fragmentInfoLog;
  string vertexInfoLog;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  
  vertexShaderSource =
       "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
  ;
  vertexInfoLog._M_dataplus._M_p = (pointer)&vertexInfoLog.field_2;
  vertexInfoLog._M_string_length = 0;
  fragmentShaderSource = "void main (void)\n{\n\tgl_FragColor = vec4(1.0);\n}";
  fragmentInfoLog._M_dataplus._M_p = (pointer)&fragmentInfoLog.field_2;
  fragmentInfoLog._M_string_length = 0;
  vertexInfoLog.field_2._M_local_buf[0] = '\0';
  fragmentInfoLog.field_2._M_local_buf[0] = '\0';
  programInfoLog._M_dataplus._M_p = (pointer)&programInfoLog.field_2;
  programInfoLog._M_string_length = 0;
  programInfoLog.field_2._M_local_buf[0] = '\0';
  GVar1 = (*gl->createProgram)();
  GVar2 = (*gl->createShader)(0x8b31);
  GVar3 = (*gl->createShader)(0x8b30);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to create shaders and program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x79);
  (*gl->shaderSource)(GVar2,1,&vertexShaderSource,(GLint *)0x0);
  (*gl->compileShader)(GVar2);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to setup vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x7d);
  (*gl->shaderSource)(GVar3,1,&fragmentShaderSource,(GLint *)0x0);
  (*gl->compileShader)(GVar3);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to setup fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x81);
  infoLogLength = 0;
  (*gl->getShaderiv)(GVar2,0x8b81,&vertexCompileStatus);
  (*gl->getShaderiv)(GVar2,0x8b84,&infoLogLength);
  std::__cxx11::string::resize((ulong)&vertexInfoLog,(char)infoLogLength);
  (*gl->getShaderInfoLog)
            (GVar2,(GLsizei)vertexInfoLog._M_string_length,&infoLogLength,
             vertexInfoLog._M_dataplus._M_p);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to get vertex shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x8c);
  std::__cxx11::string::resize((ulong)&vertexInfoLog);
  infoLogLength = 0;
  (*gl->getShaderiv)(GVar3,0x8b81,&fragmentCompileStatus);
  (*gl->getShaderiv)(GVar3,0x8b84,&infoLogLength);
  std::__cxx11::string::resize((ulong)&fragmentInfoLog,(char)infoLogLength);
  (*gl->getShaderInfoLog)
            (GVar3,(GLsizei)fragmentInfoLog._M_string_length,&infoLogLength,
             fragmentInfoLog._M_dataplus._M_p);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to get fragment shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0x9a);
  std::__cxx11::string::resize((ulong)&fragmentInfoLog);
  (*gl->attachShader)(GVar1,GVar2);
  (*gl->attachShader)(GVar1,GVar3);
  (*gl->linkProgram)(GVar1);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xa2);
  infoLogLength = 0;
  (*gl->getProgramiv)(GVar1,0x8b82,&linkStatus);
  (*gl->getProgramiv)(GVar1,0x8b84,&infoLogLength);
  std::__cxx11::string::resize((ulong)&programInfoLog,(char)infoLogLength);
  (*gl->getProgramInfoLog)
            (GVar1,(GLsizei)programInfoLog._M_string_length,&infoLogLength,
             programInfoLog._M_dataplus._M_p);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to get program link info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xad);
  std::__cxx11::string::resize((ulong)&programInfoLog);
  if (((linkStatus == 0) || (vertexCompileStatus == 0)) || (fragmentCompileStatus == 0)) {
    tcu::TestLog::startShaderProgram(log,linkStatus != 0,programInfoLog._M_dataplus._M_p);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
               ,&local_11d);
    sVar5 = (size_t)(vertexCompileStatus != 0);
    tcu::LogShader::LogShader
              ((LogShader *)&infoLogLength,QP_SHADER_TYPE_VERTEX,&local_c0,vertexCompileStatus != 0,
               &vertexInfoLog);
    tcu::LogShader::write((LogShader *)&infoLogLength,(int)log,__buf,sVar5);
    tcu::LogShader::~LogShader((LogShader *)&infoLogLength);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"void main (void)\n{\n\tgl_FragColor = vec4(1.0);\n}",&local_11d)
    ;
    sVar5 = (size_t)(fragmentCompileStatus != 0);
    tcu::LogShader::LogShader
              ((LogShader *)&infoLogLength,QP_SHADER_TYPE_FRAGMENT,&local_c0,
               fragmentCompileStatus != 0,&fragmentInfoLog);
    tcu::LogShader::write((LogShader *)&infoLogLength,(int)log,__buf_00,sVar5);
    tcu::LogShader::~LogShader((LogShader *)&infoLogLength);
    std::__cxx11::string::~string((string *)&local_c0);
    tcu::TestLog::endShaderProgram(log);
  }
  (*gl->deleteShader)(GVar2);
  (*gl->deleteShader)(GVar3);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Failed to delete shaders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
                  ,0xbf);
  if (((linkStatus != 0) && (vertexCompileStatus != 0)) && (fragmentCompileStatus != 0)) {
    std::__cxx11::string::~string((string *)&programInfoLog);
    std::__cxx11::string::~string((string *)&fragmentInfoLog);
    std::__cxx11::string::~string((string *)&vertexInfoLog);
    return GVar1;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,
             "linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeCoordMappingTests.cpp"
             ,0xc1);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

deUint32 createGLES2Program (const glw::Functions& gl, TestLog& log)
{
	const char* const vertexShaderSource =
	"attribute highp vec2 a_pos;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}";

	const char* const fragmentShaderSource =
	"void main (void)\n"
	"{\n"
	"\tgl_FragColor = vec4(1.0);\n"
	"}";

	deUint32	program			= 0;
	deUint32	vertexShader	= 0;
	deUint32	fragmentShader	= 0;

	deInt32		vertexCompileStatus;
	string		vertexInfoLog;
	deInt32		fragmentCompileStatus;
	string		fragmentInfoLog;
	deInt32		linkStatus;
	string		programInfoLog;

	try
	{
		program			= gl.createProgram();
		vertexShader	= gl.createShader(GL_VERTEX_SHADER);
		fragmentShader	= gl.createShader(GL_FRAGMENT_SHADER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create shaders and program");

		gl.shaderSource(vertexShader, 1, &vertexShaderSource, DE_NULL);
		gl.compileShader(vertexShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup vertex shader");

		gl.shaderSource(fragmentShader, 1, &fragmentShaderSource, DE_NULL);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup fragment shader");

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(vertexShader, GL_COMPILE_STATUS, &vertexCompileStatus);
			gl.getShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			vertexInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(vertexShader, (glw::GLsizei)vertexInfoLog.length(), &infoLogLength, &(vertexInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get vertex shader compile info");

			vertexInfoLog.resize(infoLogLength);
		}

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(fragmentShader, GL_COMPILE_STATUS, &fragmentCompileStatus);
			gl.getShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			fragmentInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(fragmentShader, (glw::GLsizei)fragmentInfoLog.length(), &infoLogLength, &(fragmentInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get fragment shader compile info");

			fragmentInfoLog.resize(infoLogLength);
		}

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup program");

		{
			deInt32		infoLogLength = 0;

			gl.getProgramiv(program, GL_LINK_STATUS, &linkStatus);
			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLength);

			programInfoLog.resize(infoLogLength, '\0');

			gl.getProgramInfoLog(program, (glw::GLsizei)programInfoLog.length(), &infoLogLength, &(programInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get program link info");

			programInfoLog.resize(infoLogLength);
		}

		if (linkStatus == 0 || vertexCompileStatus == 0 || fragmentCompileStatus == 0)
		{

			log.startShaderProgram(linkStatus != 0, programInfoLog.c_str());

			log << TestLog::Shader(QP_SHADER_TYPE_VERTEX, vertexShaderSource, vertexCompileStatus != 0, vertexInfoLog);
			log << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, fragmentShaderSource, fragmentCompileStatus != 0, fragmentInfoLog);

			log.endShaderProgram();
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete shaders");

		TCU_CHECK(linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0);
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		if (vertexShader)
			gl.deleteShader(vertexShader);

		if (fragmentShader)
			gl.deleteShader(fragmentShader);

		throw;
	}

	return program;
}